

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

StackSym * __thiscall Func::GetStackSymForFormal(Func *this,ArgSlot formalsIndex)

{
  StackSym **ppSVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  StackSym *pSVar6;
  
  if ((this->stackArgWithFormalsTracker == (StackArgWithFormalsTracker *)0x0) ||
     (this->stackArgWithFormalsTracker->formalsIndexToStackSymMap == (StackSym **)0x0)) {
    pSVar6 = (StackSym *)0x0;
  }
  else {
    this_00 = GetJITFunctionBody(this);
    AVar4 = JITTimeFunctionBody::GetInParamsCount(this_00);
    ppSVar1 = this->stackArgWithFormalsTracker->formalsIndexToStackSymMap;
    if ((ushort)(AVar4 - 1) <= formalsIndex) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x716,"(formalsIndex < formalsCount)","OutOfRange ? ");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pSVar6 = ppSVar1[formalsIndex];
  }
  return pSVar6;
}

Assistant:

StackSym *
Func::GetStackSymForFormal(Js::ArgSlot formalsIndex)
{
    if (stackArgWithFormalsTracker == nullptr || stackArgWithFormalsTracker->GetFormalsIndexToStackSymMap() == nullptr)
    {
        return nullptr;
    }

    Js::ArgSlot formalsCount = GetJITFunctionBody()->GetInParamsCount() - 1;
    StackSym ** formalsIndexToStackSymMap = stackArgWithFormalsTracker->GetFormalsIndexToStackSymMap();
    AssertMsg(formalsIndex < formalsCount, "OutOfRange ? ");
    return formalsIndexToStackSymMap[formalsIndex];
}